

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::AddDefineFlag(cmMakefile *this,char *flag)

{
  bool bVar1;
  size_t sVar2;
  cmMakefile *this_00;
  undefined1 local_48 [32];
  
  if (flag != (char *)0x0) {
    AddDefineFlag(this,flag,&this->DefineFlagsOrig);
    local_48._0_8_ = (cmMakefile *)(local_48 + 0x10);
    sVar2 = strlen(flag);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,flag,flag + sVar2);
    bVar1 = ParseDefineFlag(this,(string *)local_48,false);
    this_00 = (cmMakefile *)local_48._0_8_;
    if ((cmMakefile *)local_48._0_8_ != (cmMakefile *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
    if (!bVar1) {
      AddDefineFlag(this_00,flag,&this->DefineFlags);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddDefineFlag(const char* flag)
{
  if (!flag)
    {
    return;
    }

  // Update the string used for the old DEFINITIONS property.
  this->AddDefineFlag(flag, this->DefineFlagsOrig);

  // If this is really a definition, update COMPILE_DEFINITIONS.
  if(this->ParseDefineFlag(flag, false))
    {
    return;
    }

  // Add this flag that does not look like a definition.
  this->AddDefineFlag(flag, this->DefineFlags);
}